

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMAttrMapImpl::cloneContent(DOMAttrMapImpl *this,DOMAttrMapImpl *srcmap)

{
  XMLSize_t size;
  DOMNode *pDVar1;
  ushort uVar2;
  int iVar3;
  undefined4 extraout_var;
  DOMNodeVector *pDVar4;
  undefined4 extraout_var_00;
  long *plVar5;
  long lVar6;
  long lVar7;
  DOMException *this_00;
  ushort uVar8;
  ulong uVar9;
  DOMDocument *doc;
  DOMNode *elem;
  
  if ((srcmap != (DOMAttrMapImpl *)0x0) && (srcmap->fNodes != (DOMNodeVector *)0x0)) {
    if (this->fNodes == (DOMNodeVector *)0x0) {
      size = srcmap->fNodes->nextFreeSlot;
      if (size != 0) {
        iVar3 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        lVar6 = CONCAT44(extraout_var,iVar3);
        plVar5 = (long *)(lVar6 + -8);
        if (lVar6 == 0) {
          plVar5 = (long *)0x0;
        }
        doc = (DOMDocument *)(plVar5 + 1);
        if (lVar6 == 0) {
          doc = (DOMDocument *)0x0;
        }
        pDVar4 = (DOMNodeVector *)(**(code **)(*plVar5 + 0x20))(plVar5,0x18);
        DOMNodeVector::DOMNodeVector(pDVar4,doc,size);
        this->fNodes = pDVar4;
      }
    }
    else {
      DOMNodeVector::reset(this->fNodes);
    }
    pDVar4 = srcmap->fNodes;
    if (pDVar4->nextFreeSlot != 0) {
      uVar9 = 0;
      do {
        pDVar1 = pDVar4->data[uVar9];
        iVar3 = (*pDVar1->_vptr_DOMNode[0xd])(pDVar1,1);
        elem = (DOMNode *)CONCAT44(extraout_var_00,iVar3);
        if (elem == (DOMNode *)0x0) {
LAB_0025a9ac:
          this_00 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
LAB_0025aa4a:
          __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
        }
        plVar5 = (long *)__dynamic_cast(elem,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                        0xfffffffffffffffe);
        if (plVar5 == (long *)0x0) goto LAB_0025a9ac;
        lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
        if (lVar6 == 0) goto LAB_0025a9ac;
        lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
        plVar5 = (long *)__dynamic_cast(pDVar1,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                        0xfffffffffffffffe);
        if (plVar5 == (long *)0x0) {
LAB_0025a9d4:
          this_00 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
          goto LAB_0025aa4a;
        }
        lVar7 = (**(code **)(*plVar5 + 0x10))(plVar5);
        if (lVar7 == 0) goto LAB_0025a9d4;
        lVar7 = (**(code **)(*plVar5 + 0x10))(plVar5);
        uVar2 = (ushort)*(undefined4 *)(lVar6 + 0x10);
        uVar8 = uVar2 & 0xffdf;
        if ((*(ushort *)(lVar7 + 0x10) & 0x20) != 0) {
          uVar8 = uVar2 | 0x20;
        }
        *(ushort *)(lVar6 + 0x10) = uVar8;
        pDVar1 = this->fOwnerNode;
        plVar5 = (long *)__dynamic_cast(elem,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                        0xfffffffffffffffe);
        if (plVar5 == (long *)0x0) {
LAB_0025a9fc:
          this_00 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
          goto LAB_0025aa4a;
        }
        lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
        if (lVar6 == 0) goto LAB_0025a9fc;
        lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
        *(DOMNode **)(lVar6 + 8) = pDVar1;
        plVar5 = (long *)__dynamic_cast(elem,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                        0xfffffffffffffffe);
        if (plVar5 == (long *)0x0) {
LAB_0025aa24:
          this_00 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
          goto LAB_0025aa4a;
        }
        lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
        if (lVar6 == 0) goto LAB_0025aa24;
        lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
        *(ushort *)(lVar6 + 0x10) = *(ushort *)(lVar6 + 0x10) | 8;
        DOMNodeVector::addElement(this->fNodes,elem);
        uVar9 = uVar9 + 1;
        pDVar4 = srcmap->fNodes;
      } while (uVar9 < pDVar4->nextFreeSlot);
    }
  }
  return;
}

Assistant:

void DOMAttrMapImpl::cloneContent(const DOMAttrMapImpl *srcmap)
{
    if ((srcmap != 0) && (srcmap->fNodes != 0))
    {
        if (fNodes != 0)
            fNodes->reset();
        else
        {
            XMLSize_t size = srcmap->fNodes->size();
            if(size > 0) {
                DOMDocumentImpl *doc = (DOMDocumentImpl*)fOwnerNode->getOwnerDocument();
                fNodes = new (doc) DOMNodeVector(doc, size);
            }
        }

        for (XMLSize_t i = 0; i < srcmap->fNodes->size(); i++)
        {
            DOMNode *n = srcmap->fNodes->elementAt(i);
            DOMNode *clone = n->cloneNode(true);
            castToNodeImpl(clone)->isSpecified(castToNodeImpl(n)->isSpecified());
            castToNodeImpl(clone)->fOwnerNode = fOwnerNode;
            castToNodeImpl(clone)->isOwned(true);
            fNodes->addElement(clone);
        }
    }
}